

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O3

void __thiscall
KDIS::KException::KException<unsigned_char>
          (KException *this,KString *Text,KUINT16 EC,uchar AdditonalInfo)

{
  ostream *poVar1;
  KUINT16 ErrorCode;
  KStringStream ss;
  uchar local_1d9;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__KException_00220c80;
  this->m_ui16ErrorCode = EC;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)&(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_string_length = 0;
  (this->m_sErrorText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(Text->_M_dataplus)._M_p,Text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  GetErrorText_abi_cxx11_(&local_1d8,(KDIS *)(ulong)EC,ErrorCode);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_sErrorText)._M_dataplus._M_p,
                      (this->m_sErrorText)._M_string_length);
  local_1d9 = AdditonalInfo;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d9,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,(string *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }